

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

X86CPU * cpu_x86_init_x86_64(uc_struct_conflict *uc)

{
  CPUClass *k;
  TranslationBlock *pTVar1;
  X86CPUClass *xcc;
  CPUClass *cc;
  CPUState *cs;
  X86CPU *cpu;
  uc_struct_conflict *uc_local;
  
  uc_local = (uc_struct_conflict *)calloc(1,0xa7c0);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict *)0x0;
  }
  else {
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0;
    }
    else if (0x25 < (uint)uc->cpu_model) {
      free(uc_local);
      return (X86CPU *)0x0;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x47f);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    *(undefined4 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1cfc) =
         0xffffffff;
    *(undefined4 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1d1c) =
         0xffffffff;
    *(undefined4 *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x3a4) = 0xffffffff;
    *(undefined4 *)((long)((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x1d24) =
         0xffffffff;
    cpu_class_init((uc_struct *)uc,k);
    x86_cpu_common_class_init(uc,k,(void *)0x0);
    pTVar1 = (TranslationBlock *)calloc(1,0x20);
    ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494] = pTVar1;
    if (((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494] == (TranslationBlock *)0x0) {
      free(uc_local);
      uc_local = (uc_struct_conflict *)0x0;
    }
    else {
      *(undefined4 *)&((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494]->cs_base =
           0xfffffffe;
      ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494]->pc =
           (target_ulong)(builtin_x86_defs + uc->cpu_model);
      if (((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494]->pc == 0) {
        free(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x494]);
        free(uc_local);
        uc_local = (uc_struct_conflict *)0x0;
      }
      else {
        cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
        x86_cpu_initfn(uc,(CPUState *)uc_local);
        x86_cpu_realizefn(uc,(CPUState *)uc_local);
        cpu_address_space_init_x86_64((CPUState *)uc_local,0,((CPUState *)uc_local)->memory);
        qemu_init_vcpu_x86_64((CPUState *)uc_local);
      }
    }
  }
  return (X86CPU *)uc_local;
}

Assistant:

X86CPU *cpu_x86_init(struct uc_struct *uc)
{
    X86CPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    X86CPUClass *xcc;

    cpu = calloc(1, sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }

    if (uc->cpu_model == INT_MAX) {
#ifdef TARGET_X86_64
        uc->cpu_model = UC_CPU_X86_QEMU64; // qemu64
#else
        uc->cpu_model = UC_CPU_X86_QEMU32; // qemu32
#endif
    } else if (uc->cpu_model >= ARRAY_SIZE(builtin_x86_defs)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = (CPUState *)cpu;
    cpu->env.cpuid_level_func7 = UINT32_MAX;
    cpu->env.cpuid_level = UINT32_MAX;
    cpu->env.cpuid_xlevel = UINT32_MAX;
    cpu->env.cpuid_xlevel2 = UINT32_MAX;

    /* init CPUClass */
    cpu_class_init(uc, cc);

    /* init X86CPUClass */
    x86_cpu_common_class_init(uc, cc, NULL);

    /* init X86CPUModel */
    /* Ignore X86CPUVersion, X86CPUVersionDefinition.
       we do not need so many cpu types and their property.
       version: more typename. x86_cpu_versioned_model_name().
       alias: more property. */
    xcc = &cpu->cc;
    xcc->model = calloc(1, sizeof(*(xcc->model)));
    if (xcc->model == NULL) {
        free(cpu);
        return NULL;
    }

    xcc->model->version = CPU_VERSION_AUTO;
    xcc->model->cpudef = &builtin_x86_defs[uc->cpu_model];

    if (xcc->model->cpudef == NULL) {
        free(xcc->model);
        free(cpu);
        return NULL;
    }

    /* init CPUState */
    cpu_common_initfn(uc, cs);

    /* init X86CPU */
    x86_cpu_initfn(uc, cs);

    /* realize X86CPU */
    x86_cpu_realizefn(uc, cs);

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    /* realize CPUState */

    return cpu;
}